

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O1

el_action_t vi_replace_char(EditLine *el,wint_t c)

{
  el_action_t eVar1;
  
  eVar1 = '\x06';
  if ((el->el_line).cursor < (el->el_line).lastchar) {
    (el->el_map).current = (el->el_map).key;
    (el->el_state).inputmode = L'\x02';
    cv_undo(el);
    eVar1 = '\x03';
  }
  return eVar1;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
vi_replace_char(EditLine *el, wint_t c __attribute__((__unused__)))
{

	if (el->el_line.cursor >= el->el_line.lastchar)
		return CC_ERROR;

	el->el_map.current = el->el_map.key;
	el->el_state.inputmode = MODE_REPLACE_1;
	cv_undo(el);
	return CC_ARGHACK;
}